

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

bool __thiscall UniValue::setFloat(UniValue *this,double val_)

{
  bool bVar1;
  ostringstream oss;
  string local_1b0;
  long local_190;
  undefined8 local_188 [46];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x10;
  std::ostream::_M_insert<double>(val_);
  std::__cxx11::stringbuf::str();
  bVar1 = setNumStr(this,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  this->typ = VNUM;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return bVar1;
}

Assistant:

bool UniValue::setFloat(double val_)
{
    std::ostringstream oss;

    oss << std::setprecision(16) << val_;

    bool ret = setNumStr(oss.str());
    typ = VNUM;
    return ret;
}